

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-preprocess.cpp
# Opt level: O0

bool dg::llvmdg::
     hasRelevantPredecessor<std::set<llvm::BasicBlock*,std::less<llvm::BasicBlock*>,std::allocator<llvm::BasicBlock*>>>
               (BasicBlock *B,
               set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>
               *relevant)

{
  bool bVar1;
  PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_> __x;
  PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_> this;
  size_type sVar2;
  pred_range pVar3;
  BasicBlock *p;
  PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_> __end2;
  PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_> __begin2;
  pred_range *__range2;
  reference in_stack_ffffffffffffffb8;
  BasicBlock *in_stack_ffffffffffffffc0;
  
  pVar3 = llvm::predecessors(in_stack_ffffffffffffffc0);
  __x = llvm::
        iterator_range<llvm::PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_>_>
        ::begin((iterator_range<llvm::PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_>_>
                 *)&stack0xffffffffffffffd0);
  this = llvm::
         iterator_range<llvm::PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_>_>
         ::end((iterator_range<llvm::PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_>_>
                *)&stack0xffffffffffffffd0);
  while( true ) {
    bVar1 = llvm::PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_>::
            operator!=((PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_>
                        *)this.It.UI.U,(Self *)in_stack_ffffffffffffffb8);
    if (!bVar1) {
      return false;
    }
    in_stack_ffffffffffffffb8 =
         llvm::PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_>::
         operator*((PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_> *)
                   0x1ccec9);
    sVar2 = std::
            set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>
            ::count((set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>
                     *)pVar3.begin_iterator.It.UI.U.It,(key_type *)__x.It.UI.U);
    if (sVar2 != 0) break;
    llvm::PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_>::operator++
              ((PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_> *)
               this.It.UI.U);
  }
  return true;
}

Assistant:

inline bool hasRelevantPredecessor(llvm::BasicBlock *B, const C &relevant) {
    for (auto *p : llvm::predecessors(B)) {
        if (relevant.count(p) > 0)
            return true;
    }
    return false;
}